

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::MessagePattern::autoQuoteApostropheDeep
          (UnicodeString *__return_storage_ptr__,MessagePattern *this)

{
  char cVar1;
  Part *pPVar2;
  undefined8 in_RAX;
  long lVar3;
  long lVar4;
  undefined8 uStack_38;
  
  cVar1 = this->needsAutoQuoting;
  uStack_38 = in_RAX;
  UnicodeString::UnicodeString(__return_storage_ptr__,&this->msg);
  if ((cVar1 != '\0') && (lVar3 = (long)this->partsLength, 0 < lVar3)) {
    lVar4 = lVar3 + 1;
    lVar3 = lVar3 * 0x10 + -6;
    do {
      pPVar2 = this->parts;
      if (*(int *)((long)pPVar2 + lVar3 + -10) == 3) {
        uStack_38 = CONCAT26(*(undefined2 *)((long)&pPVar2->type + lVar3),(undefined6)uStack_38);
        UnicodeString::doReplace
                  (__return_storage_ptr__,*(int32_t *)((long)pPVar2 + lVar3 + -6),0,
                   (UChar *)((long)&uStack_38 + 6),0,1);
      }
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x10;
    } while (1 < lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
MessagePattern::autoQuoteApostropheDeep() const {
    if(!needsAutoQuoting) {
        return msg;
    }
    UnicodeString modified(msg);
    // Iterate backward so that the insertion indexes do not change.
    int32_t count=countParts();
    for(int32_t i=count; i>0;) {
        const Part &part=getPart(--i);
        if(part.getType()==UMSGPAT_PART_TYPE_INSERT_CHAR) {
           modified.insert(part.index, (UChar)part.value);
        }
    }
    return modified;
}